

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void cupdlp_twoNormSquared(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_float *res)

{
  ulong uVar1;
  cupdlp_float cVar2;
  
  if (n < 1) {
    cVar2 = 0.0;
  }
  else {
    cVar2 = 0.0;
    uVar1 = 0;
    do {
      cVar2 = cVar2 + x[uVar1] * x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  *res = cVar2;
  return;
}

Assistant:

double dot(cupdlp_int n, const cupdlp_float *x, cupdlp_int incx, const cupdlp_float *y,
           cupdlp_int incy) {
#ifdef USE_MY_BLAS
  assert(incx == 1 && incy == 1);

  double dres = 0.0;

  for (int i = 0; i < n; ++i) {
    dres += x[i] * y[i];
  }

  return dres;
#else
  return ddot(n, x, incx, y, incy);
#endif
}